

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

UnionState * __thiscall
capnp::_::(anonymous_namespace)::
initUnion<capnproto_test::capnp::test::TestUnion,capnp::_::(anonymous_namespace)::TestCase194::run()::__3>
          (UnionState *__return_storage_ptr__,_anonymous_namespace_ *this,
          anon_class_1_0_00000001 *initializer)

{
  Builder b;
  initializer_list<unsigned_int> discriminants_00;
  ArrayDisposer *this_00;
  bool bVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  word *pwVar3;
  word *pwVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  uint local_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  iterator local_1d8;
  undefined8 local_1d0;
  word *local_1c8;
  uint8_t *discriminants;
  word *pwStack_1b8;
  uint8_t bits;
  uint8_t *p;
  size_t sStack_1a8;
  int offset;
  Fault local_1a0;
  Fault f;
  size_t local_190;
  DebugExpression<unsigned_long> local_188;
  undefined1 local_180 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  undefined1 auStack_148 [8];
  ArrayPtr<const_capnp::word> segment;
  Builder local_128;
  undefined1 local_100 [8];
  MallocMessageBuilder builder;
  anon_class_1_0_00000001 *initializer_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)this;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_100,0x400,GROW_HEURISTICALLY);
  this_00 = builder.moreSegments.builder.disposer;
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestUnion>
            (&local_128,(MessageBuilder *)local_100);
  b._builder.capTable = local_128._builder.capTable;
  b._builder.segment = local_128._builder.segment;
  b._builder.data = local_128._builder.data;
  b._builder.pointers = local_128._builder.pointers;
  b._builder.dataSize = local_128._builder.dataSize;
  b._builder.pointerCount = local_128._builder.pointerCount;
  b._builder._38_2_ = local_128._builder._38_2_;
  anon_unknown_0::TestCase194::run::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this_00,b);
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  _kjCondition._32_8_ = AVar5.ptr;
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result,0);
  auStack_148 = (undefined1  [8])pAVar2->ptr;
  segment.ptr = (word *)pAVar2->size_;
  local_190 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)auStack_148);
  local_188 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_190);
  f.exception._4_4_ = 2;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_180,&local_188,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  if (!bVar1) {
    sStack_1a8 = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)auStack_148);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0xaa,FAILED,"segment.size() > 2","_kjCondition,segment.size()",
               (DebugComparison<unsigned_long,_int> *)local_180,&stack0xfffffffffffffe58);
    kj::_::Debug::Fault::fatal(&local_1a0);
  }
  p._4_4_ = 0;
  pwStack_1b8 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)auStack_148);
  pwStack_1b8 = pwStack_1b8 + 2;
  do {
    pwVar4 = pwStack_1b8;
    pwVar3 = kj::ArrayPtr<const_capnp::word>::end((ArrayPtr<const_capnp::word> *)auStack_148);
    if (pwVar3 <= pwVar4) {
      p._4_4_ = -1;
LAB_0017dc53:
      pwVar4 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)auStack_148);
      local_1c8 = pwVar4 + 1;
      local_1e8 = (uint)(byte)local_1c8->content;
      local_1e4 = (uint)*(byte *)((long)&pwVar4[1].content + 2);
      local_1e0 = (uint)*(byte *)((long)&pwVar4[1].content + 4);
      local_1dc = (uint)*(byte *)((long)&pwVar4[1].content + 6);
      local_1d8 = &local_1e8;
      local_1d0 = 4;
      discriminants_00._M_len = 4;
      discriminants_00._M_array = local_1d8;
      anon_unknown_0::UnionState::UnionState(__return_storage_ptr__,discriminants_00,p._4_4_);
      MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_100);
      return __return_storage_ptr__;
    }
    if ((char)pwStack_1b8->content != '\0') {
      for (discriminants._7_1_ = (byte)pwStack_1b8->content; (discriminants._7_1_ & 1) == 0;
          discriminants._7_1_ = (byte)((int)(uint)discriminants._7_1_ >> 1)) {
        p._4_4_ = p._4_4_ + 1;
      }
      goto LAB_0017dc53;
    }
    p._4_4_ = p._4_4_ + 8;
    pwStack_1b8 = (word *)((long)&pwStack_1b8->content + 1);
  } while( true );
}

Assistant:

UnionState initUnion(Func&& initializer) {
  // Use the given setter to initialize the given union field and then return a struct indicating
  // the location of the data that was written as well as the values of the four union
  // discriminants.

  MallocMessageBuilder builder;
  initializer(builder.getRoot<StructType>());
  kj::ArrayPtr<const word> segment = builder.getSegmentsForOutput()[0];

  KJ_ASSERT(segment.size() > 2, segment.size());

  // Find the offset of the first set bit after the union discriminants.
  int offset = 0;
  for (const uint8_t* p = reinterpret_cast<const uint8_t*>(segment.begin() + 2);
       p < reinterpret_cast<const uint8_t*>(segment.end()); p++) {
    if (*p != 0) {
      uint8_t bits = *p;
      while ((bits & 1) == 0) {
        ++offset;
        bits >>= 1;
      }
      goto found;
    }
    offset += 8;
  }
  offset = -1;

found:
  const uint8_t* discriminants = reinterpret_cast<const uint8_t*>(segment.begin() + 1);
  return UnionState({discriminants[0], discriminants[2], discriminants[4], discriminants[6]},
                    offset);
}